

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O3

_tess_edges * __thiscall
glcts::TessellationShaderVertexSpacing::getEdgesForQuadsTessellation
          (_tess_edges *__return_storage_ptr__,TessellationShaderVertexSpacing *this,_run *run)

{
  pointer pcVar1;
  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
  *pvVar2;
  iterator __position;
  _tess_coordinate_cartesian __comp;
  undefined4 uVar3;
  _run *p_Var4;
  _tess_coordinate_cartesian *coordinate;
  _tess_coordinate_cartesian *p_Var5;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  _Var6;
  TestError *this_00;
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing vertex_spacing;
  uint n_edge;
  ulong uVar7;
  long lVar8;
  undefined8 unaff_RBP;
  undefined8 uVar9;
  __normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_*,_std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>_>
  __last;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
  coordinates;
  float denominator;
  float Dy;
  _tess_edge *edge_ptrs [4];
  _tess_coordinate_cartesian *corner_coordinate_ptrs [4];
  string vertex_spacing_string;
  string primitive_mode_string;
  _tess_coordinate_cartesian local_3a8;
  _tess_coordinate_cartesian local_3a0;
  _tess_coordinate_cartesian local_398;
  _tess_coordinate_cartesian local_390;
  _tess_coordinate_cartesian *local_388;
  iterator iStack_380;
  _tess_coordinate_cartesian *local_378;
  float local_36c;
  _tess_edges *local_368;
  float local_35c;
  undefined4 local_358;
  float local_354;
  float local_350;
  float local_34c;
  void *local_348;
  iterator iStack_340;
  _tess_coordinate_cartesian *local_338;
  float local_330;
  float local_32c;
  float local_328;
  void *local_318;
  iterator iStack_310;
  _tess_coordinate_cartesian *local_308;
  float local_300;
  float local_2fc;
  float local_2f8;
  void *local_2e8;
  iterator iStack_2e0;
  _tess_coordinate_cartesian *local_2d8;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  void *local_2b8;
  iterator iStack_2b0;
  _tess_coordinate_cartesian *local_2a8;
  float local_2a0;
  float local_29c;
  float local_298;
  _run *local_290;
  _tess_coordinate_cartesian local_288;
  undefined8 uStack_280;
  TessellationShaderVertexSpacing *local_270;
  vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
  *local_268;
  void **local_260;
  void **local_258;
  void **local_250;
  _tess_coordinate_cartesian *local_248 [4];
  string local_228;
  string local_208;
  undefined1 local_1e8 [16];
  float local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  float local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378 = (_tess_coordinate_cartesian *)0x0;
  local_388 = (_tess_coordinate_cartesian *)0x0;
  iStack_380._M_current = (_tess_coordinate_cartesian *)0x0;
  local_368 = __return_storage_ptr__;
  local_270 = this;
  if (run->n_vertices != 0) {
    uVar7 = 0;
    uVar10 = 0;
    do {
      pcVar1 = (run->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1b0._0_4_ = *(undefined4 *)(pcVar1 + (uVar7 & 0xffffffff) * 4);
      local_1b0._4_4_ = *(undefined4 *)(pcVar1 + (uVar7 & 0xffffffff) * 4 + 4);
      if (iStack_380._M_current == local_378) {
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
        ::
        _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                  ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                    *)&local_388,iStack_380,(_tess_coordinate_cartesian *)local_1b0);
      }
      else {
        (iStack_380._M_current)->x = (float)local_1b0._0_4_;
        (iStack_380._M_current)->y = (float)local_1b0._4_4_;
        iStack_380._M_current = iStack_380._M_current + 1;
      }
      uVar10 = uVar10 + 1;
      uVar7 = uVar7 + 3;
    } while (uVar10 < run->n_vertices);
  }
  local_35c = run->inner[0];
  uVar9 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  local_290 = run;
  do {
    local_390.x = 0.0;
    local_390.y = 0.0;
    local_398.x = 0.0;
    local_398.y = 0.0;
    local_3a0.x = 0.0;
    local_3a0.y = 0.0;
    local_3a8.x = 0.0;
    local_3a8.y = 0.0;
    if (local_388 != iStack_380._M_current) {
      fVar15 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
      p_Var5 = local_388;
      do {
        fVar17 = p_Var5->x + -0.5;
        fVar18 = p_Var5->y + -0.5;
        fVar16 = SQRT(fVar17 * fVar17 + fVar18 * fVar18);
        if (((fVar17 <= 0.0) && (0.0 <= fVar18)) && (fVar15 < fVar16)) {
          local_390 = *p_Var5;
          fVar15 = fVar16;
        }
        if (((0.0 <= fVar17) && (0.0 <= fVar18)) && (fVar12 < fVar16)) {
          local_398 = *p_Var5;
          fVar12 = fVar16;
        }
        if (((fVar17 <= 0.0) && (fVar18 <= 0.0)) && (fVar13 < fVar16)) {
          local_3a0 = *p_Var5;
          fVar13 = fVar16;
        }
        if (((0.0 <= fVar17) && (fVar18 <= 0.0)) && (fVar14 < fVar16)) {
          local_3a8 = *p_Var5;
          fVar14 = fVar16;
        }
        p_Var5 = p_Var5 + 1;
      } while (p_Var5 != iStack_380._M_current);
    }
    local_248[0] = &local_390;
    local_248[1] = &local_398;
    local_248[2] = &local_3a0;
    local_248[3] = &local_3a8;
    lVar8 = 0;
    do {
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_equals_val<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const>>
                        (local_388,iStack_380._M_current,local_248[lVar8]);
      if (_Var6._M_current != iStack_380._M_current) {
        p_Var5 = _Var6._M_current + 1;
        if (p_Var5 != iStack_380._M_current) {
          memmove(_Var6._M_current,p_Var5,(long)iStack_380._M_current - (long)p_Var5);
        }
        iStack_380._M_current = iStack_380._M_current + -1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    local_2a0 = SQRT((local_390.x - local_398.x) * (local_390.x - local_398.x) +
                     (local_390.y - local_398.y) * (local_390.y - local_398.y));
    local_2d0 = SQRT((local_398.x - local_3a8.x) * (local_398.x - local_3a8.x) +
                     (local_398.y - local_3a8.y) * (local_398.y - local_3a8.y));
    local_300 = SQRT((local_3a8.x - local_3a0.x) * (local_3a8.x - local_3a0.x) +
                     (local_3a8.y - local_3a0.y) * (local_3a8.y - local_3a0.y));
    local_330 = SQRT((local_3a0.x - local_390.x) * (local_3a0.x - local_390.x) +
                     (local_3a0.y - local_390.y) * (local_3a0.y - local_390.y));
    local_2a8 = (_tess_coordinate_cartesian *)0x0;
    local_2b8 = (void *)0x0;
    iStack_2b0._M_current = (_tess_coordinate_cartesian *)0x0;
    local_2d8 = (_tess_coordinate_cartesian *)0x0;
    local_2e8 = (void *)0x0;
    iStack_2e0._M_current = (_tess_coordinate_cartesian *)0x0;
    local_308 = (_tess_coordinate_cartesian *)0x0;
    local_318 = (void *)0x0;
    iStack_310._M_current = (_tess_coordinate_cartesian *)0x0;
    local_338 = (_tess_coordinate_cartesian *)0x0;
    local_348 = (void *)0x0;
    iStack_340._M_current = (_tess_coordinate_cartesian *)0x0;
    local_29c = run->outer[3];
    local_2cc = run->outer[2];
    local_2fc = run->outer[1];
    local_32c = run->outer[0];
    local_2c8 = local_2cc;
    local_328 = local_32c;
    local_298 = local_29c;
    local_2f8 = local_2fc;
    if ((char)uVar9 == '\0') {
      local_298 = run->inner[0] + -2.0;
      local_2c8 = run->inner[1] + -2.0;
      local_328 = local_2c8;
      local_2f8 = local_298;
    }
    std::
    vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
    ::_M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
              ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                *)&local_2b8,(iterator)0x0,&local_390);
    fVar14 = local_390.x - local_398.x;
    fVar12 = -fVar14;
    if (-fVar14 <= fVar14) {
      fVar12 = fVar14;
    }
    if (0.001 <= fVar12) {
LAB_00cbdfb5:
      if (iStack_2b0._M_current == local_2a8) {
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
        ::
        _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                  ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                    *)&local_2b8,iStack_2b0,&local_398);
      }
      else {
        *iStack_2b0._M_current = local_398;
        iStack_2b0._M_current = iStack_2b0._M_current + 1;
      }
    }
    else {
      fVar14 = local_390.y - local_398.y;
      fVar12 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar12 = fVar14;
      }
      if (0.001 <= fVar12) goto LAB_00cbdfb5;
    }
    if (iStack_2e0._M_current == local_2d8) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
      ::_M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                  *)&local_2e8,iStack_2e0,&local_398);
    }
    else {
      *iStack_2e0._M_current = local_398;
      iStack_2e0._M_current = iStack_2e0._M_current + 1;
    }
    fVar14 = local_398.x - local_3a8.x;
    fVar12 = -fVar14;
    if (-fVar14 <= fVar14) {
      fVar12 = fVar14;
    }
    if (0.001 <= fVar12) {
LAB_00cbe06b:
      if (iStack_2e0._M_current == local_2d8) {
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
        ::
        _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                  ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                    *)&local_2e8,iStack_2e0,&local_3a8);
      }
      else {
        *iStack_2e0._M_current = local_3a8;
        iStack_2e0._M_current = iStack_2e0._M_current + 1;
      }
    }
    else {
      fVar14 = local_398.y - local_3a8.y;
      fVar12 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar12 = fVar14;
      }
      if (0.001 <= fVar12) goto LAB_00cbe06b;
    }
    if (iStack_310._M_current == local_308) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
      ::_M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                  *)&local_318,iStack_310,&local_3a8);
    }
    else {
      *iStack_310._M_current = local_3a8;
      iStack_310._M_current = iStack_310._M_current + 1;
    }
    fVar14 = local_3a8.x - local_3a0.x;
    fVar12 = -fVar14;
    if (-fVar14 <= fVar14) {
      fVar12 = fVar14;
    }
    if (0.001 <= fVar12) {
LAB_00cbe120:
      if (iStack_310._M_current == local_308) {
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
        ::
        _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                  ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                    *)&local_318,iStack_310,&local_3a0);
      }
      else {
        *iStack_310._M_current = local_3a0;
        iStack_310._M_current = iStack_310._M_current + 1;
      }
    }
    else {
      fVar14 = local_3a8.y - local_3a0.y;
      fVar12 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar12 = fVar14;
      }
      if (0.001 <= fVar12) goto LAB_00cbe120;
    }
    if (iStack_340._M_current == local_338) {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
      ::_M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                  *)&local_348,iStack_340,&local_3a0);
    }
    else {
      *iStack_340._M_current = local_3a0;
      iStack_340._M_current = iStack_340._M_current + 1;
    }
    fVar14 = local_3a0.x - local_390.x;
    fVar12 = -fVar14;
    if (-fVar14 <= fVar14) {
      fVar12 = fVar14;
    }
    if (0.001 <= fVar12) {
LAB_00cbe1d0:
      if (iStack_340._M_current == local_338) {
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
        ::
        _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                  ((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                    *)&local_348,iStack_340,&local_390);
      }
      else {
        *iStack_340._M_current = local_390;
        iStack_340._M_current = iStack_340._M_current + 1;
      }
    }
    else {
      fVar14 = local_3a0.y - local_390.y;
      fVar12 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar12 = fVar14;
      }
      if (0.001 <= fVar12) goto LAB_00cbe1d0;
    }
    local_358 = (undefined4)uVar9;
    local_268 = (vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                 *)&local_2b8;
    local_260 = &local_2e8;
    local_258 = &local_318;
    local_250 = &local_348;
    lVar8 = 0;
    do {
      pvVar2 = (&local_268)[lVar8];
      _Var6._M_current = *(_tess_coordinate_cartesian **)pvVar2;
      __last._M_current = *(_tess_coordinate_cartesian **)(pvVar2 + 8);
      if (8 < (ulong)((long)__last._M_current - (long)_Var6._M_current)) {
        fVar12 = ((_tess_coordinate_cartesian *)&(_Var6._M_current)->x)->x;
        fVar14 = (_Var6._M_current)->y;
        __comp = *_Var6._M_current;
        if (local_388 != iStack_380._M_current) {
          fVar15 = ((_tess_coordinate_cartesian *)&_Var6._M_current[1].x)->x;
          local_36c = _Var6._M_current[1].y;
          local_288.x = fVar12;
          fVar12 = fVar12 - fVar15;
          local_34c = fVar14 - local_36c;
          local_350 = SQRT(fVar12 * fVar12 + local_34c * local_34c);
          local_1c8 = -fVar12;
          uStack_1c4 = 0x80000000;
          uStack_1c0 = 0x80000000;
          uStack_1bc = 0x80000000;
          local_1e8 = ZEXT416((uint)fVar15);
          local_1d8 = -fVar15 * fVar14;
          uStack_1d4 = 0x80000000;
          uStack_1d0 = 0x80000000;
          uStack_1cc = 0x80000000;
          p_Var5 = local_388;
          local_354 = fVar14;
          do {
            fVar12 = p_Var5->x;
            fVar14 = p_Var5->y;
            fVar13 = local_288.x * local_36c + local_34c * fVar12 + fVar14 * local_1c8 + local_1d8;
            fVar15 = -fVar13;
            if (-fVar13 <= fVar13) {
              fVar15 = fVar13;
            }
            fVar15 = fVar15 / local_350;
            fVar13 = -fVar15;
            if (-fVar15 <= fVar15) {
              fVar13 = fVar15;
            }
            if (fVar13 < 0.001) {
              fVar13 = local_288.x - fVar12;
              fVar15 = -fVar13;
              if (-fVar13 <= fVar13) {
                fVar15 = fVar13;
              }
              if (fVar15 < 0.001) {
                fVar13 = local_354 - fVar14;
                fVar15 = -fVar13;
                if (-fVar13 <= fVar13) {
                  fVar15 = fVar13;
                }
                if (fVar15 < 0.001) goto LAB_00cbe410;
              }
              fVar12 = local_1e8._0_4_ - fVar12;
              fVar15 = -fVar12;
              if (-fVar12 <= fVar12) {
                fVar15 = fVar12;
              }
              if (fVar15 < 0.001) {
                fVar14 = local_36c - fVar14;
                fVar12 = -fVar14;
                if (-fVar14 <= fVar14) {
                  fVar12 = fVar14;
                }
                if (fVar12 < 0.001) goto LAB_00cbe410;
              }
              _Var6 = std::
                      __find_if<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_pred<glcts::TessellationShaderVertexSpacing::_comparator_exact_tess_coordinate_match>>
                                (*p_Var5,*(undefined8 *)pvVar2,*(undefined8 *)(pvVar2 + 8));
              p_Var4 = local_290;
              __position._M_current = *(_tess_coordinate_cartesian **)(pvVar2 + 8);
              if (_Var6._M_current != __position._M_current) {
                TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                          (&local_208,(TessellationShaderUtils *)(ulong)local_290->primitive_mode,
                           primitive_mode);
                TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                          (&local_228,(TessellationShaderUtils *)(ulong)p_Var4->vertex_spacing,
                           vertex_spacing);
                local_1b0 = (undefined1  [8])
                            ((local_270->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                            )->m_log;
                std::__cxx11::ostringstream::ostringstream(local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"A duplicate vertex",0x12);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
                std::ostream::_M_insert<double>((double)p_Var5->x);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                std::ostream::_M_insert<double>((double)p_Var5->y);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           ") was found in set of coordinates generated for the following configuration:"
                           ,0x4c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," inner tessellation levels:(",0x1c);
                std::ostream::_M_insert<double>((double)p_Var4->inner[0]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                std::ostream::_M_insert<double>((double)p_Var4->inner[1]);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,") outer tessellation levels:(",0x1d);
                std::ostream::_M_insert<double>((double)p_Var4->outer[0]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                std::ostream::_M_insert<double>((double)p_Var4->outer[1]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                std::ostream::_M_insert<double>((double)p_Var4->outer[2]);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                std::ostream::_M_insert<double>((double)p_Var4->outer[3]);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,") primitive mode:",0x11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                           local_208._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," vertex spacing mode:",0x15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                           local_228._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8," point mode:yes",0xf);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(local_1a8);
                std::ios_base::~ios_base(local_138);
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,
                           "A duplicate vertex was found in generated tessellation coordinate set when point mode was used"
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                           ,0x1d9);
                __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
              if (_Var6._M_current == *(_tess_coordinate_cartesian **)(pvVar2 + 0x10)) {
                std::
                vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>
                ::
                _M_realloc_insert<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const&>
                          (pvVar2,__position,p_Var5);
              }
              else {
                *__position._M_current = *p_Var5;
                *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
              }
            }
LAB_00cbe410:
            p_Var5 = p_Var5 + 1;
          } while (p_Var5 != iStack_380._M_current);
          _Var6._M_current = *(_tess_coordinate_cartesian **)pvVar2;
          __last._M_current = *(_tess_coordinate_cartesian **)(pvVar2 + 8);
        }
        if (_Var6._M_current != __last._M_current) {
          uVar7 = (long)__last._M_current - (long)_Var6._M_current >> 3;
          lVar11 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar11 == 0; lVar11 = lVar11 + -1) {
            }
          }
          uStack_280 = 0;
          local_288 = __comp;
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glcts::TessellationShaderVertexSpacing::_comparator_relative_to_base_point>>
                    (_Var6,__last,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<glcts::TessellationShaderVertexSpacing::_comparator_relative_to_base_point>
                      )__comp);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_comp_iter<glcts::TessellationShaderVertexSpacing::_comparator_relative_to_base_point>>
                    (_Var6,__last,
                     (_Iter_comp_iter<glcts::TessellationShaderVertexSpacing::_comparator_relative_to_base_point>
                      )local_288);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    do {
      pvVar2 = (&local_268)[lVar8];
      lVar11 = *(long *)pvVar2;
      if (lVar11 != *(long *)(pvVar2 + 8)) {
        do {
          _Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian*,std::vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>>>,__gnu_cxx::__ops::_Iter_equals_val<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian_const>>
                            (local_388,iStack_380._M_current,lVar11);
          if (_Var6._M_current != iStack_380._M_current) {
            p_Var5 = _Var6._M_current + 1;
            if (p_Var5 != iStack_380._M_current) {
              memmove(_Var6._M_current,p_Var5,(long)iStack_380._M_current - (long)p_Var5);
            }
            iStack_380._M_current = iStack_380._M_current + -1;
          }
          lVar11 = lVar11 + 8;
        } while (lVar11 != *(long *)(pvVar2 + 8));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    do {
      std::
      vector<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
      ::push_back(local_368,(value_type *)(&local_268)[lVar8]);
      uVar3 = local_358;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    if (local_348 != (void *)0x0) {
      operator_delete(local_348,(long)local_338 - (long)local_348);
    }
    run = local_290;
    if (local_318 != (void *)0x0) {
      operator_delete(local_318,(long)local_308 - (long)local_318);
    }
    if (local_2e8 != (void *)0x0) {
      operator_delete(local_2e8,(long)local_2d8 - (long)local_2e8);
    }
    if (local_2b8 != (void *)0x0) {
      operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
    }
    uVar9 = 0;
    if ((1.0 < local_35c & (byte)uVar3) == 0) {
      if (local_388 != (_tess_coordinate_cartesian *)0x0) {
        operator_delete(local_388,(long)local_378 - (long)local_388);
      }
      return local_368;
    }
  } while( true );
}

Assistant:

TessellationShaderVertexSpacing::_tess_edges TessellationShaderVertexSpacing::getEdgesForQuadsTessellation(
	const _run& run)
{
	_tess_edges result;

	/* First, convert the raw coordinate array into a vector of cartesian coordinates.
	 * For this method, we will need to take out vertices in no specific order. */
	std::vector<_tess_coordinate_cartesian> coordinates;

	for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
	{
		_tess_coordinate_cartesian new_coordinate;
		const float*			   vertex_data = (const float*)(&run.data[0]) + 3 /* components */ * n_vertex;

		new_coordinate.x = vertex_data[0];
		new_coordinate.y = vertex_data[1];

		coordinates.push_back(new_coordinate);
	}

	/* Data set is expected to describe an outer and inner rectangles. We will execute the quad extraction
	 * process in two iterations:
	 *
	 * - first iteration will determine all coordinates that are part of the outer quad;
	 * - second iteration will focus on the inner quad.
	 *
	 * Each iteration will start from identifying corner vertices:
	 *
	 * - top-left corner     (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be positive);
	 * - top-right corner    (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be positive);
	 * - bottom-left corner  (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be negative);
	 * - bottom-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be negative);
	 *
	 * Once we know where the corner vertices are, we will remove them from the data set and iterate again over the
	 * data set to identify all points that are part of edges connecting the edge corners. After the loop is done,
	 * these vertices will have been associated with relevant edges and removed from the data sets.
	 *
	 * Once two iterations are complete, we're done.
	 */
	const unsigned int n_iterations = (run.inner[0] > 1) ? 2 : 1;

	for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
	{
		_tess_coordinate_cartesian current_tl_point;
		float					   current_tl_point_delta = 0.0f;
		_tess_coordinate_cartesian current_tr_point;
		float					   current_tr_point_delta = 0.0f;
		_tess_coordinate_cartesian current_bl_point;
		float					   current_bl_point_delta = 0.0f;
		_tess_coordinate_cartesian current_br_point;
		float					   current_br_point_delta = 0.0f;

		/* Iterate over all points */
		for (std::vector<_tess_coordinate_cartesian>::const_iterator coordinate_iterator = coordinates.begin();
			 coordinate_iterator != coordinates.end(); coordinate_iterator++)
		{
			const _tess_coordinate_cartesian& coordinate = *coordinate_iterator;
			float							  delta_x	= coordinate.x - 0.5f;
			float							  delta_y	= coordinate.y - 0.5f;
			float							  delta		 = deFloatSqrt(delta_x * delta_x + delta_y * delta_y);

			/* top-left corner (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be positive); */
			if (delta_x <= 0.0f && delta_y >= 0.0f)
			{
				if (delta > current_tl_point_delta)
				{
					current_tl_point	   = coordinate;
					current_tl_point_delta = delta;
				}
			}

			/* top-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be positive); */
			if (delta_x >= 0.0f && delta_y >= 0.0f)
			{
				if (delta > current_tr_point_delta)
				{
					current_tr_point	   = coordinate;
					current_tr_point_delta = delta;
				}
			}

			/* bottom-left corner (x delta from (0.5, 0.5) should be negative, y delta from (0.5, 0.5) should be negative); */
			if (delta_x <= 0.0f && delta_y <= 0.0f)
			{
				if (delta > current_bl_point_delta)
				{
					current_bl_point	   = coordinate;
					current_bl_point_delta = delta;
				}
			}

			/* bottom-right corner (x delta from (0.5, 0.5) should be positive, y delta from (0.5, 0.5) should be negative); */
			if (delta_x >= 0.0f && delta_y <= 0.0f)
			{
				if (delta > current_br_point_delta)
				{
					current_br_point	   = coordinate;
					current_br_point_delta = delta;
				}
			}
		} /* for (all coordinates) */

		/* Note: If any of the outer tessellation level is 1, at least
		 *       two "current" points will refer to the same point.
		 *
		 * Now that we know where the corner vertices are, remove them from the data set
		 */
		const _tess_coordinate_cartesian* corner_coordinate_ptrs[] = { &current_tl_point, &current_tr_point,
																	   &current_bl_point, &current_br_point };
		const unsigned int n_corner_coordinate_ptrs =
			sizeof(corner_coordinate_ptrs) / sizeof(corner_coordinate_ptrs[0]);

		for (unsigned int n_corner_coordinate = 0; n_corner_coordinate < n_corner_coordinate_ptrs;
			 ++n_corner_coordinate)
		{
			const _tess_coordinate_cartesian& corner_coordinate = *(corner_coordinate_ptrs[n_corner_coordinate]);
			std::vector<_tess_coordinate_cartesian>::iterator iterator =
				std::find(coordinates.begin(), coordinates.end(), corner_coordinate);

			/* Iterator can be invalid at this point of any of the corner coordinates
			 * referred more than once to the same point. */
			if (iterator != coordinates.end())
			{
				coordinates.erase(iterator);
			}
		} /* for (all corner coordinates) */

		/* Proceed with identification of coordinates describing the edges.
		 *
		 * Note: for inner quad, we need to subtract 2 segments connecting outer and inner coordinates */
		float tl_tr_delta =
			deFloatSqrt((current_tl_point.x - current_tr_point.x) * (current_tl_point.x - current_tr_point.x) +
						(current_tl_point.y - current_tr_point.y) * (current_tl_point.y - current_tr_point.y));
		float tr_br_delta =
			deFloatSqrt((current_tr_point.x - current_br_point.x) * (current_tr_point.x - current_br_point.x) +
						(current_tr_point.y - current_br_point.y) * (current_tr_point.y - current_br_point.y));
		float br_bl_delta =
			deFloatSqrt((current_br_point.x - current_bl_point.x) * (current_br_point.x - current_bl_point.x) +
						(current_br_point.y - current_bl_point.y) * (current_br_point.y - current_bl_point.y));
		float bl_tl_delta =
			deFloatSqrt((current_bl_point.x - current_tl_point.x) * (current_bl_point.x - current_tl_point.x) +
						(current_bl_point.y - current_tl_point.y) * (current_bl_point.y - current_tl_point.y));

		_tess_edge tl_tr_edge(0, 0, tl_tr_delta);
		_tess_edge tr_br_edge(0, 0, tr_br_delta);
		_tess_edge br_bl_edge(0, 0, br_bl_delta);
		_tess_edge bl_tl_edge(0, 0, bl_tl_delta);

		tl_tr_edge.outermost_tess_level = run.outer[3];
		tr_br_edge.outermost_tess_level = run.outer[2];
		br_bl_edge.outermost_tess_level = run.outer[1];
		bl_tl_edge.outermost_tess_level = run.outer[0];

		if (n_iteration == 0)
		{
			tl_tr_edge.tess_level = run.outer[3];
			tr_br_edge.tess_level = run.outer[2];
			br_bl_edge.tess_level = run.outer[1];
			bl_tl_edge.tess_level = run.outer[0];
		}
		else
		{
			tl_tr_edge.tess_level = run.inner[0] - 2 /* segments between inner and outer edges */;
			br_bl_edge.tess_level = run.inner[0] - 2 /* segments between inner and outer edges */;
			tr_br_edge.tess_level = run.inner[1] - 2 /* segments between inner and outer edges */;
			bl_tl_edge.tess_level = run.inner[1] - 2 /* segments between inner and outer edges */;
		}

		/* Add corner points to edge descriptors. Do *NOT* add the same point twice, as
		 * that will confuse verifyEdges() and cause incorrect failures.
		 */
		tl_tr_edge.points.push_back(current_tl_point);

		if (!(current_tl_point == current_tr_point))
		{
			tl_tr_edge.points.push_back(current_tr_point);
		}

		tr_br_edge.points.push_back(current_tr_point);

		if (!(current_tr_point == current_br_point))
		{
			tr_br_edge.points.push_back(current_br_point);
		}

		br_bl_edge.points.push_back(current_br_point);

		if (!(current_br_point == current_bl_point))
		{
			br_bl_edge.points.push_back(current_bl_point);
		}

		bl_tl_edge.points.push_back(current_bl_point);

		if (!(current_bl_point == current_tl_point))
		{
			bl_tl_edge.points.push_back(current_tl_point);
		}

		/* Identify points that lie on any of the edges considered */
		_tess_edge*		   edge_ptrs[] = { &tl_tr_edge, &tr_br_edge, &br_bl_edge, &bl_tl_edge };
		const unsigned int n_edge_ptrs = sizeof(edge_ptrs) / sizeof(edge_ptrs[0]);

		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			/* Degenerate edges will only consist of one point, for which the following
			 * code needs not be executed */
			if (edge.points.size() > 1)
			{
				/* Retrieve edge's start & end points */
				_tess_coordinate_cartesian edge_start_point = edge.points[0];
				_tess_coordinate_cartesian edge_end_point   = edge.points[1];

				/* Iterate over the data set */
				for (std::vector<_tess_coordinate_cartesian>::const_iterator iterator = coordinates.begin();
					 iterator != coordinates.end(); iterator++)
				{
					const _tess_coordinate_cartesian& coordinate = *iterator;

					if (isPointOnLine(edge_start_point, edge_end_point, coordinate) &&
						!(edge_start_point == coordinate) && !(edge_end_point == coordinate))
					{
						/* Make sure the point has not already been added. If this happens,
						 * it is very likely there is a bug in the way the implementation's
						 * support of point mode */
						if (std::find_if(edge.points.begin(), edge.points.end(),
										 _comparator_exact_tess_coordinate_match(coordinate)) == edge.points.end())
						{
							edge.points.push_back(coordinate);
						}
						else
						{
							std::string primitive_mode_string =
								TessellationShaderUtils::getESTokenForPrimitiveMode(run.primitive_mode);
							std::string vertex_spacing_string =
								TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

							m_testCtx.getLog()
								<< tcu::TestLog::Message << "A duplicate vertex"
								<< " (" << coordinate.x << ", " << coordinate.y
								<< ") was found in set of coordinates generated for the following configuration:"
								<< " inner tessellation levels:(" << run.inner[0] << ", " << run.inner[1]
								<< ") outer tessellation levels:(" << run.outer[0] << ", " << run.outer[1] << ", "
								<< run.outer[2] << ", " << run.outer[3] << ") primitive mode:" << primitive_mode_string
								<< " vertex spacing mode:" << vertex_spacing_string << " point mode:yes"
								<< tcu::TestLog::EndMessage;

							TCU_FAIL("A duplicate vertex was found in generated tessellation coordinate set "
									 "when point mode was used");
						}
					}
				} /* for (all coordinates in the data set) */

				/* Sort all points in the edge relative to the start point */
				std::sort(edge.points.begin(), edge.points.end(), _comparator_relative_to_base_point(edge_start_point));
			}
		} /* for (all edges) */

		/* Remove all coordinates associated to edges from the data set */
		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			for (std::vector<_tess_coordinate_cartesian>::const_iterator iterator = edge.points.begin();
				 iterator != edge.points.end(); iterator++)
			{
				const _tess_coordinate_cartesian&				  coordinate = *iterator;
				std::vector<_tess_coordinate_cartesian>::iterator dataset_iterator =
					std::find(coordinates.begin(), coordinates.end(), coordinate);

				if (dataset_iterator != coordinates.end())
				{
					coordinates.erase(dataset_iterator);
				}
			} /* for (all edge points) */
		}	 /* for (all edges) */

		/* Store the edges */
		for (unsigned int n_edge = 0; n_edge < n_edge_ptrs; ++n_edge)
		{
			_tess_edge& edge = *(edge_ptrs[n_edge]);

			result.push_back(edge);
		}
	} /* for (both iterations) */

	return result;
}